

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char * fmt::v8::detail::
       parse_width<char,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>_>
                 *handler)

{
  dynamic_format_specs<char> *pdVar1;
  int iVar2;
  char *begin_00;
  char *local_28;
  width_adapter local_20;
  
  local_28 = begin;
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/fmt-src/include/fmt/core.h"
                ,0x95f,"");
  }
  if ((byte)(*begin - 0x30U) < 10) {
    iVar2 = parse_nonnegative_int<char>(&local_28,end,-1);
    if (iVar2 == -1) {
      throw_format_error("number is too big");
    }
    ((handler->
     super_dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>
     ).super_specs_setter<char>.specs_)->width = iVar2;
  }
  else if (*begin == '{') {
    begin_00 = begin + 1;
    local_28 = begin_00;
    if (begin_00 != end) {
      local_20.handler = handler;
      if ((*begin_00 == ':') || (*begin_00 == '}')) {
        iVar2 = compile_parse_context<char,_fmt::v8::detail::error_handler>::next_arg_id
                          ((handler->
                           super_dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>
                           ).context_);
        pdVar1 = (handler->
                 super_dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,_fmt::v8::detail::error_handler>_>
                 ).specs_;
        (pdVar1->width_ref).kind = index;
        (pdVar1->width_ref).val.index = iVar2;
        local_28 = begin_00;
      }
      else {
        local_28 = do_parse_arg_id<char,fmt::v8::detail::parse_width<char,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>>&>(char_const*,char_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::dynamic_specs_handler<fmt::v8::detail::compile_parse_context<char,fmt::v8::detail::error_handler>>>&)::width_adapter&>
                             (begin_00,end,&local_20);
      }
    }
    if ((local_28 == end) || (*local_28 != '}')) {
      throw_format_error("invalid format string");
    }
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

FMT_CONSTEXPR auto parse_width(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct width_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_width(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_width(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_width(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int width = parse_nonnegative_int(begin, end, -1);
    if (width != -1)
      handler.on_width(width);
    else
      handler.on_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    if (begin != end) begin = parse_arg_id(begin, end, width_adapter{handler});
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}